

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O3

void secp256k1_sha256_finalize(secp256k1_sha256 *hash,uchar *out32)

{
  uint32_t *puVar1;
  long lVar2;
  ulong uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  uint uVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  long lVar31;
  uint uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint32_t sizedesc [2];
  uint32_t out [8];
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  uVar3 = hash->bytes;
  uVar32 = (uint)uVar3;
  uVar20 = (uint)(uVar3 >> 0x20);
  local_50 = uVar20 >> 0x15 & 0xff |
             uVar20 >> 5 & 0xff00 | (uint)(uVar3 >> 0x15) & 0xff0000 | (int)(uVar3 >> 0x1d) << 0x18;
  local_4c = (uint)(uVar3 >> 0x15) & 0xff |
             (uint)(uVar3 >> 5) & 0xff00 | (uVar32 & 0x1fe0) << 0xb | uVar32 << 0x1b;
  secp256k1_sha256_write(hash,secp256k1_sha256_finalize::pad,(ulong)(0x37 - uVar32 & 0x3f) + 1);
  secp256k1_sha256_write(hash,(uchar *)&local_50,8);
  lVar31 = 0;
  do {
    auVar33 = *(undefined1 (*) [16])(hash->s + lVar31);
    auVar34[1] = 0;
    auVar34[0] = auVar33[8];
    auVar34[2] = auVar33[9];
    auVar34[3] = 0;
    auVar34[4] = auVar33[10];
    auVar34[5] = 0;
    auVar34[6] = auVar33[0xb];
    auVar34[7] = 0;
    auVar34[8] = auVar33[0xc];
    auVar34[9] = 0;
    auVar34[10] = auVar33[0xd];
    auVar34[0xb] = 0;
    auVar34[0xc] = auVar33[0xe];
    auVar34[0xd] = 0;
    auVar34[0xe] = auVar33[0xf];
    auVar34[0xf] = 0;
    auVar34 = pshuflw(auVar34,auVar34,0x1b);
    auVar34 = pshufhw(auVar34,auVar34,0x1b);
    auVar21[0xd] = 0;
    auVar21._0_13_ = auVar33._0_13_;
    auVar21[0xe] = auVar33[7];
    auVar22[0xc] = auVar33[6];
    auVar22._0_12_ = auVar33._0_12_;
    auVar22._13_2_ = auVar21._13_2_;
    auVar23[0xb] = 0;
    auVar23._0_11_ = auVar33._0_11_;
    auVar23._12_3_ = auVar22._12_3_;
    auVar24[10] = auVar33[5];
    auVar24._0_10_ = auVar33._0_10_;
    auVar24._11_4_ = auVar23._11_4_;
    auVar25[9] = 0;
    auVar25._0_9_ = auVar33._0_9_;
    auVar25._10_5_ = auVar24._10_5_;
    auVar26[8] = auVar33[4];
    auVar26._0_8_ = auVar33._0_8_;
    auVar26._9_6_ = auVar25._9_6_;
    auVar28._7_8_ = 0;
    auVar28._0_7_ = auVar26._8_7_;
    auVar29._1_8_ = SUB158(auVar28 << 0x40,7);
    auVar29[0] = auVar33[3];
    auVar29._9_6_ = 0;
    auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
    auVar30[0] = auVar33[2];
    auVar30._11_4_ = 0;
    auVar27[2] = auVar33[1];
    auVar27._0_2_ = auVar33._0_2_;
    auVar27._3_12_ = SUB1512(auVar30 << 0x20,3);
    auVar33._0_2_ = auVar33._0_2_ & 0xff;
    auVar33._2_13_ = auVar27._2_13_;
    auVar33[0xf] = 0;
    auVar33 = pshuflw(auVar33,auVar33,0x1b);
    auVar33 = pshufhw(auVar33,auVar33,0x1b);
    sVar4 = auVar33._0_2_;
    sVar5 = auVar33._2_2_;
    sVar6 = auVar33._4_2_;
    sVar7 = auVar33._6_2_;
    sVar8 = auVar33._8_2_;
    sVar9 = auVar33._10_2_;
    sVar10 = auVar33._12_2_;
    sVar11 = auVar33._14_2_;
    sVar12 = auVar34._0_2_;
    sVar13 = auVar34._2_2_;
    sVar14 = auVar34._4_2_;
    sVar15 = auVar34._6_2_;
    sVar16 = auVar34._8_2_;
    sVar17 = auVar34._10_2_;
    sVar18 = auVar34._12_2_;
    sVar19 = auVar34._14_2_;
    lVar2 = lVar31 * 4;
    *(char *)((long)&local_48 + lVar2) = (0 < sVar4) * (sVar4 < 0x100) * auVar33[0] - (0xff < sVar4)
    ;
    *(char *)((long)&local_48 + lVar2 + 1) =
         (0 < sVar5) * (sVar5 < 0x100) * auVar33[2] - (0xff < sVar5);
    *(char *)((long)&local_48 + lVar2 + 2) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar33[4] - (0xff < sVar6);
    *(char *)((long)&local_48 + lVar2 + 3) =
         (0 < sVar7) * (sVar7 < 0x100) * auVar33[6] - (0xff < sVar7);
    *(char *)((long)&local_48 + lVar2 + 4) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar33[8] - (0xff < sVar8);
    *(char *)((long)&local_48 + lVar2 + 5) =
         (0 < sVar9) * (sVar9 < 0x100) * auVar33[10] - (0xff < sVar9);
    *(char *)((long)&local_48 + lVar2 + 6) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar33[0xc] - (0xff < sVar10);
    *(char *)((long)&local_48 + lVar2 + 7) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar33[0xe] - (0xff < sVar11);
    *(char *)((long)&uStack_40 + lVar2) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar34[0] - (0xff < sVar12);
    *(char *)((long)&uStack_40 + lVar2 + 1) =
         (0 < sVar13) * (sVar13 < 0x100) * auVar34[2] - (0xff < sVar13);
    *(char *)((long)&uStack_40 + lVar2 + 2) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar34[4] - (0xff < sVar14);
    *(char *)((long)&uStack_40 + lVar2 + 3) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar34[6] - (0xff < sVar15);
    *(char *)((long)&uStack_40 + lVar2 + 4) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar34[8] - (0xff < sVar16);
    *(char *)((long)&uStack_40 + lVar2 + 5) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar34[10] - (0xff < sVar17);
    *(char *)((long)&uStack_40 + lVar2 + 6) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar34[0xc] - (0xff < sVar18);
    *(char *)((long)&uStack_40 + lVar2 + 7) =
         (0 < sVar19) * (sVar19 < 0x100) * auVar34[0xe] - (0xff < sVar19);
    puVar1 = hash->s + lVar31;
    puVar1[0] = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    lVar31 = lVar31 + 4;
  } while (lVar31 != 8);
  *(undefined8 *)(out32 + 0x10) = local_38;
  *(undefined8 *)(out32 + 0x18) = uStack_30;
  *(undefined8 *)out32 = local_48;
  *(undefined8 *)(out32 + 8) = uStack_40;
  return;
}

Assistant:

static void secp256k1_sha256_finalize(secp256k1_sha256 *hash, unsigned char *out32) {
    static const unsigned char pad[64] = {0x80, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0};
    uint32_t sizedesc[2];
    uint32_t out[8];
    int i = 0;
    sizedesc[0] = BE32(hash->bytes >> 29);
    sizedesc[1] = BE32(hash->bytes << 3);
    secp256k1_sha256_write(hash, pad, 1 + ((119 - (hash->bytes % 64)) % 64));
    secp256k1_sha256_write(hash, (const unsigned char*)sizedesc, 8);
    for (i = 0; i < 8; i++) {
        out[i] = BE32(hash->s[i]);
        hash->s[i] = 0;
    }
    memcpy(out32, (const unsigned char*)out, 32);
}